

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_secp256k1_byteorder_tests(void)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t x__1;
  uchar buf_1 [8];
  uchar x_be_1 [8];
  uint64_t x_1;
  uint32_t x_;
  uchar buf [4];
  uchar x_be [4];
  uint32_t x;
  uchar local_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  uint32_t local_10;
  uchar local_c [4];
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0xff03ab45;
  local_8 = 0x45ab03ff;
  secp256k1_write_be32(local_c,0xff03ab45);
  iVar1 = secp256k1_memcmp_var(local_c,&local_8,4);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d41,"test condition failed: secp256k1_memcmp_var(buf, x_be, sizeof(buf)) == 0");
    abort();
  }
  local_10 = secp256k1_read_be32(local_c);
  if (local_10 != 0xff03ab45) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d44,"test condition failed: x == x_");
    abort();
  }
  local_18 = 0xcafe0123beef4567;
  local_20 = 0x6745efbe2301feca;
  secp256k1_write_be64(local_28,0xcafe0123beef4567);
  iVar1 = secp256k1_memcmp_var(local_28,&local_20,8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d4e,"test condition failed: secp256k1_memcmp_var(buf, x_be, sizeof(buf)) == 0");
    abort();
  }
  uVar2 = secp256k1_read_be64(local_28);
  if (uVar2 != 0xcafe0123beef4567) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d51,"test condition failed: x == x_");
    abort();
  }
  return;
}

Assistant:

static void run_secp256k1_byteorder_tests(void) {
    {
        const uint32_t x = 0xFF03AB45;
        const unsigned char x_be[4] = {0xFF, 0x03, 0xAB, 0x45};
        unsigned char buf[4];
        uint32_t x_;

        secp256k1_write_be32(buf, x);
        CHECK(secp256k1_memcmp_var(buf, x_be, sizeof(buf)) == 0);

        x_ = secp256k1_read_be32(buf);
        CHECK(x == x_);
    }

    {
        const uint64_t x = 0xCAFE0123BEEF4567;
        const unsigned char x_be[8] = {0xCA, 0xFE, 0x01, 0x23, 0xBE, 0xEF, 0x45, 0x67};
        unsigned char buf[8];
        uint64_t x_;

        secp256k1_write_be64(buf, x);
        CHECK(secp256k1_memcmp_var(buf, x_be, sizeof(buf)) == 0);

        x_ = secp256k1_read_be64(buf);
        CHECK(x == x_);
    }
}